

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
::AssertHashEqConsistent<std::__cxx11::string>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  size_t size;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  ushort uVar4;
  MixingHashState MVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [16];
  uint uVar8;
  ulong uVar9;
  uint64_t v;
  long lVar10;
  size_t hash_of_arg;
  ulong local_50;
  anon_class_24_3_2b146c49 local_48;
  
  if (1 < *(ulong *)(this + 8)) {
    size = key->_M_string_length;
    MVar5 = hash_internal::MixingHashState::combine_contiguous
                      ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                       (uchar *)(key->_M_dataplus)._M_p,size);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = MVar5.state_ + size;
    local_50 = SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar9 = *(ulong *)this;
    if (uVar9 < 0x11) {
      lVar10 = *(long *)(this + 0x18);
      local_48.hash_of_arg = &local_50;
      pauVar7 = *(undefined1 (**) [16])(this + 0x10);
      local_48.key = key;
      local_48.this =
           (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this;
      if (uVar9 < 0xf) {
        if (8 < uVar9) {
          __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x753,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::basic_string<char>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
        uVar9 = *(ulong *)(*pauVar7 + uVar9) & 0x8080808080808080;
        if (uVar9 != 0x8080808080808080) {
          uVar9 = uVar9 ^ 0x8080808080808080;
          do {
            uVar6 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar6 = uVar6 >> 3 & 0x1fffffff;
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::
            AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::anon_class_24_3_2b146c49::operator()
                      (&local_48,pauVar7[-1] + uVar6 + 0xf,
                       (slot_type *)((ulong)(uint)((int)uVar6 << 5) + lVar10 + -0x20));
            uVar9 = uVar9 & uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
      else {
        uVar9 = *(ulong *)(this + 8) >> 1;
        if (1 < *(ulong *)(this + 8)) {
          uVar6 = uVar9;
          while( true ) {
            auVar2 = *pauVar7;
            uVar8 = (uint)(ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar2[0xf] >> 7) << 0xf);
            if (uVar8 != 0xffff) {
              uVar8 = ~uVar8;
              do {
                uVar1 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
                  }
                }
                if ((char)(*pauVar7)[uVar1] < '\0') {
                  __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x764,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::basic_string<char>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                               );
                }
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::anon_class_24_3_2b146c49::operator()
                          (&local_48,*pauVar7 + uVar1,(slot_type *)((ulong)(uVar1 << 5) + lVar10));
                uVar6 = uVar6 - 1;
                uVar4 = (ushort)(uVar8 - 1) & (ushort)uVar8;
                uVar8 = CONCAT22((short)(uVar8 - 1 >> 0x10),uVar4);
              } while (uVar4 != 0);
            }
            if (uVar6 == 0) break;
            lVar10 = lVar10 + 0x200;
            puVar3 = *pauVar7;
            pauVar7 = pauVar7 + 1;
            if (puVar3[0xf] == -1) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::basic_string<char>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
        }
        if (uVar9 < *(ulong *)(this + 8) >> 1) {
          __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x770,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = std::basic_string<char>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
      }
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }